

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg-idct.c
# Opt level: O1

void pjpeg_idct_2D_double(int32_t *in,uint8_t *out,uint32_t outstride)

{
  double dVar1;
  int i;
  long lVar2;
  int x;
  long lVar3;
  int u_1;
  int iVar4;
  int u;
  ulong uVar5;
  double *pdVar6;
  undefined1 *puVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double tmp [64];
  double dout [64];
  double din [64];
  double local_638 [64];
  undefined1 local_438 [512];
  double local_238 [65];
  
  lVar2 = 0;
  do {
    local_238[lVar2] = (double)in[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  pdVar6 = local_638;
  lVar2 = 0;
  do {
    local_638[lVar2 * 8 + 6] = 0.0;
    local_638[lVar2 * 8 + 7] = 0.0;
    local_638[lVar2 * 8 + 4] = 0.0;
    local_638[lVar2 * 8 + 5] = 0.0;
    local_638[lVar2 * 8 + 2] = 0.0;
    local_638[lVar2 * 8 + 3] = 0.0;
    local_638[lVar2 * 8] = 0.0;
    local_638[lVar2 * 8 + 1] = 0.0;
    iVar4 = 0;
    uVar5 = 0;
    dVar9 = 0.7071067811865475;
    do {
      dVar10 = local_238[lVar2 * 8 + uVar5];
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        uVar8 = uVar5 & 0xffffffff;
        lVar3 = 0;
        do {
          dVar1 = cos((double)(int)uVar8 * 3.141592653589793 * 0.0625);
          pdVar6[lVar3] = dVar1 * dVar9 * dVar10 + pdVar6[lVar3];
          lVar3 = lVar3 + 1;
          uVar8 = (ulong)(uint)((int)uVar8 + iVar4);
        } while (lVar3 != 8);
      }
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + 2;
      dVar9 = 1.0;
    } while (uVar5 != 8);
    lVar2 = lVar2 + 1;
    pdVar6 = pdVar6 + 8;
  } while (lVar2 != 8);
  puVar7 = local_438;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      *(undefined8 *)(puVar7 + lVar3) = 0;
      lVar3 = lVar3 + 0x40;
    } while (lVar3 != 0x200);
    iVar4 = 0;
    uVar5 = 0;
    dVar9 = 0.7071067811865475;
    do {
      dVar10 = local_638[lVar2 + uVar5 * 8];
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        uVar8 = uVar5 & 0xffffffff;
        lVar3 = 0;
        do {
          dVar1 = cos((double)(int)uVar8 * 3.141592653589793 * 0.0625);
          *(double *)(puVar7 + lVar3) = dVar1 * dVar9 * dVar10 + *(double *)(puVar7 + lVar3);
          lVar3 = lVar3 + 0x40;
          uVar8 = (ulong)(uint)((int)uVar8 + iVar4);
        } while (lVar3 != 0x200);
      }
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + 2;
      dVar9 = 1.0;
    } while (uVar5 != 8);
    lVar2 = lVar2 + 1;
    puVar7 = puVar7 + 8;
  } while (lVar2 != 8);
  puVar7 = local_438;
  iVar4 = 0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      dVar10 = *(double *)(puVar7 + lVar3 * 8) * 0.25 + 128.0;
      dVar9 = 0.0;
      if (0.0 <= dVar10) {
        dVar9 = dVar10;
      }
      dVar10 = 255.0;
      if (dVar9 <= 255.0) {
        dVar10 = dVar9;
      }
      *(double *)(puVar7 + lVar3 * 8) = dVar10;
      out[(uint)(iVar4 + (int)lVar3)] = (uint8_t)(int)dVar10;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    lVar2 = lVar2 + 1;
    iVar4 = iVar4 + outstride;
    puVar7 = puVar7 + 0x40;
  } while (lVar2 != 8);
  return;
}

Assistant:

void pjpeg_idct_2D_double(int32_t in[64], uint8_t *out, uint32_t outstride)
{
    double din[64], dout[64];
    for (int i = 0; i < 64; i++)
        din[i] = in[i];

    double tmp[64];

    // idct on rows
    for (int y = 0; y < 8; y++)
        idct_1D_double(&din[8*y], 1, &tmp[8*y], 1);

    // idct on columns
    for (int x = 0; x < 8; x++)
        idct_1D_double(&tmp[x], 8, &dout[x], 8);

    // scale, adjust bias, and clamp
    for (int y = 0; y < 8; y++) {
        for (int x = 0; x < 8; x++) {
            int i = 8*y + x;

            dout[i] = (dout[i] / 4) + 128;
            if (dout[i] < 0)
                dout[i] = 0;
            if (dout[i] > 255)
                dout[i] = 255;

            // XXX round by adding +.5?
            out[y*outstride + x] = dout[i];
        }
    }
}